

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_dir.c
# Opt level: O3

int DIR_stat(void *opaque,char *name,PHYSFS_Stat *stat)

{
  PHYSFS_Stat *st;
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  char *buf;
  PHYSFS_Stat **ppPVar4;
  undefined1 *ptr;
  ulong len;
  PHYSFS_Stat *local_38;
  
  ppPVar4 = &local_38;
  local_38 = stat;
  if (opaque == (void *)0x0) {
    sVar2 = 0;
  }
  else {
    sVar2 = strlen((char *)opaque);
  }
  sVar3 = strlen(name);
  len = sVar3 + sVar2 + 1;
  iVar1 = 0;
  if (len < 0x100) {
    ppPVar4 = (PHYSFS_Stat **)((long)&local_38 - (sVar3 + sVar2 + 0x18 & 0xfffffffffffffff0));
    ptr = (undefined1 *)ppPVar4;
  }
  else {
    ptr = (undefined1 *)0x0;
  }
  *(undefined8 *)((long)ppPVar4 + -8) = 0x10c44b;
  buf = (char *)__PHYSFS_initSmallAlloc(ptr,len);
  *(undefined8 *)((long)ppPVar4 + -8) = 0x10c45f;
  cvtToDependent((char *)opaque,name,buf,len);
  st = local_38;
  if (buf != (char *)0x0) {
    *(undefined8 *)((long)ppPVar4 + -8) = 0x10c470;
    iVar1 = __PHYSFS_platformStat(buf,st);
    *(undefined8 *)((long)ppPVar4 + -8) = 0x10c47b;
    __PHYSFS_smallFree(buf);
  }
  return iVar1;
}

Assistant:

static int DIR_stat(void *opaque, const char *name, PHYSFS_Stat *stat)
{
    int retval = 0;
    char *d;

    CVT_TO_DEPENDENT(d, opaque, name);
    BAIL_IF_ERRPASS(!d, 0);
    retval = __PHYSFS_platformStat(d, stat);
    __PHYSFS_smallFree(d);
    return retval;
}